

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O3

int DSA_generate_parameters_ex
              (DSA *dsa,uint bits,uint8_t *seed_in,size_t seed_len,int *out_counter,
              unsigned_long *out_h,BN_GENCB *cb)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  EVP_MD *md_00;
  undefined4 extraout_var;
  BN_CTX *ctx;
  BIGNUM *pBVar6;
  BIGNUM *r;
  BIGNUM *pBVar7;
  BIGNUM *ret;
  BIGNUM *a;
  BIGNUM *rem;
  BIGNUM *r_00;
  BIGNUM *r_01;
  BIGNUM *pBVar8;
  ulong uVar9;
  BN_MONT_CTX *m_ctx;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  bool bVar13;
  uchar md [32];
  uchar buf [32];
  uchar buf2 [32];
  uchar seed [32];
  int local_124;
  uint local_c8;
  undefined8 local_c0;
  byte local_b8 [32];
  char local_98 [32];
  byte local_78 [32];
  uchar local_58 [40];
  ulong __n;
  
  if (10000 < bits) {
    ERR_put_error(10,0,0x6b,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa.cc"
                  ,0xaa);
    return 0;
  }
  if (bits < 0x800) {
    md_00 = EVP_sha1();
  }
  else {
    md_00 = EVP_sha256();
  }
  iVar2 = EVP_MD_size(md_00);
  __n = CONCAT44(extraout_var,iVar2);
  uVar10 = 0x200;
  if (0x200 < bits) {
    uVar10 = bits;
  }
  bVar13 = seed_in == (uint8_t *)0x0;
  if (!bVar13) {
    if (seed_len < __n) {
      return 0;
    }
    if (__n != 0) {
      memcpy(local_58,seed_in,__n);
    }
  }
  ctx = (BN_CTX *)BN_CTX_new();
  if (ctx == (BN_CTX *)0x0) {
    return 0;
  }
  BN_CTX_start((BN_CTX *)ctx);
  pBVar6 = BN_CTX_get((BN_CTX *)ctx);
  r = BN_CTX_get((BN_CTX *)ctx);
  pBVar7 = BN_CTX_get((BN_CTX *)ctx);
  ret = BN_CTX_get((BN_CTX *)ctx);
  a = BN_CTX_get((BN_CTX *)ctx);
  rem = BN_CTX_get((BN_CTX *)ctx);
  r_00 = BN_CTX_get((BN_CTX *)ctx);
  r_01 = BN_CTX_get((BN_CTX *)ctx);
  if (r_01 != (BIGNUM *)0x0) {
    pBVar8 = BN_value_one();
    uVar10 = (uVar10 + 0x3f & 0x7fc0) - 1;
    iVar3 = BN_lshift(r_01,pBVar8,uVar10);
    if (iVar3 != 0) {
      local_c0 = __n - 1;
      local_c8 = uVar10 / 0xa0;
      local_124 = 0;
LAB_0020d56b:
      do {
        iVar3 = BN_GENCB_call((BN_GENCB *)cb,0,local_124);
        if ((iVar3 == 0) || ((bVar13 != false && (iVar3 = RAND_bytes(local_58,iVar2), iVar3 == 0))))
        {
          iVar3 = 0;
          break;
        }
        if (__n != 0) {
          memcpy(local_98,local_58,__n);
          memcpy(local_78,local_58,__n);
          uVar9 = __n - 2;
          do {
            pcVar1 = local_98 + uVar9 + 1;
            *pcVar1 = *pcVar1 + '\x01';
            if (*pcVar1 != '\0') break;
            bVar12 = uVar9 < __n;
            uVar9 = uVar9 - 1;
          } while (bVar12);
        }
        iVar4 = EVP_Digest(local_58,__n,local_b8,(uint *)0x0,md_00,(ENGINE *)0x0);
        iVar3 = 0;
        if (iVar4 == 0) break;
        iVar4 = EVP_Digest(local_98,__n,local_78,(uint *)0x0,md_00,(ENGINE *)0x0);
        iVar3 = 0;
        if (iVar4 == 0) break;
        if (__n != 0) {
          uVar9 = 0;
          do {
            local_b8[uVar9] = local_b8[uVar9] ^ local_78[uVar9];
            uVar9 = uVar9 + 1;
          } while (__n != uVar9);
        }
        local_b8[0] = local_b8[0] | 0x80;
        local_b8[__n - 1] = local_b8[__n - 1] | 1;
        pBVar8 = BN_bin2bn(local_b8,iVar2,ret);
        iVar3 = 0;
        if (pBVar8 == (BIGNUM *)0x0) break;
        local_124 = local_124 + 1;
        iVar4 = BN_is_prime_fasttest_ex(ret,0x32,(BN_CTX *)ctx,(uint)bVar13,(BN_GENCB *)cb);
        if (0 < iVar4) {
          iVar4 = BN_GENCB_call((BN_GENCB *)cb,2,0);
          iVar3 = 0;
          if (iVar4 == 0) break;
          iVar4 = BN_GENCB_call((BN_GENCB *)cb,3,0);
          iVar3 = 0;
          if (iVar4 == 0) break;
          iVar4 = 0;
          do {
            if (iVar4 != 0) {
              iVar5 = BN_GENCB_call((BN_GENCB *)cb,0,iVar4);
              iVar3 = 0;
              if (iVar5 == 0) goto LAB_0020d903;
            }
            BN_zero((BIGNUM *)pBVar7);
            uVar9 = local_c0;
            uVar11 = 0;
LAB_0020d72f:
            do {
              if (uVar9 < __n) {
                pcVar1 = local_98 + uVar9;
                *pcVar1 = *pcVar1 + '\x01';
                uVar9 = uVar9 - 1;
                if (*pcVar1 == '\0') goto LAB_0020d72f;
              }
              iVar3 = 0;
              iVar5 = EVP_Digest(local_98,__n,local_b8,(uint *)0x0,md_00,(ENGINE *)0x0);
              if ((((iVar5 == 0) ||
                   (pBVar8 = BN_bin2bn(local_b8,iVar2,pBVar6), pBVar8 == (BIGNUM *)0x0)) ||
                  (iVar5 = BN_lshift(pBVar6,pBVar6,iVar2 * 8 * uVar11), iVar5 == 0)) ||
                 (iVar5 = BN_add(pBVar7,pBVar7,pBVar6), iVar5 == 0)) goto LAB_0020d903;
              bVar13 = uVar11 != local_c8;
              uVar9 = local_c0;
              uVar11 = uVar11 + 1;
            } while (bVar13);
            iVar5 = BN_mask_bits(pBVar7,uVar10);
            if (((iVar5 == 0) || (pBVar8 = BN_copy(a,pBVar7), pBVar8 == (BIGNUM *)0x0)) ||
               ((iVar5 = BN_add(a,a,r_01), iVar5 == 0 ||
                (iVar5 = BN_lshift1(pBVar6,ret), iVar5 == 0)))) goto LAB_0020d903;
            iVar3 = 0;
            iVar5 = BN_div((BIGNUM *)0x0,rem,a,pBVar6,(BN_CTX *)ctx);
            if (iVar5 == 0) goto LAB_0020d903;
            pBVar8 = BN_value_one();
            iVar5 = BN_sub(pBVar6,rem,pBVar8);
            if ((iVar5 == 0) || (iVar5 = BN_sub(r_00,a,pBVar6), iVar5 == 0)) goto LAB_0020d903;
            iVar5 = BN_cmp(r_00,r_01);
            if (-1 < iVar5) {
              iVar5 = BN_is_prime_fasttest_ex(r_00,0x32,(BN_CTX *)ctx,1,(BN_GENCB *)cb);
              if (0 < iVar5) {
                iVar2 = BN_GENCB_call((BN_GENCB *)cb,2,1);
                if (iVar2 == 0) goto LAB_0020d903;
                pBVar7 = BN_value_one();
                iVar2 = BN_sub(r_01,r_00,pBVar7);
                if (iVar2 == 0) goto LAB_0020d903;
                iVar2 = BN_div(pBVar6,(BIGNUM *)0x0,r_01,ret,(BN_CTX *)ctx);
                iVar3 = 0;
                if ((iVar2 == 0) ||
                   (m_ctx = (BN_MONT_CTX *)BN_MONT_CTX_new_for_modulus((BIGNUM *)r_00,ctx),
                   m_ctx == (BN_MONT_CTX *)0x0)) goto LAB_0020d903;
                iVar2 = BN_set_word(r_01,2);
                iVar5 = 0;
                iVar3 = 0;
                if ((iVar2 == 0) ||
                   (iVar2 = BN_mod_exp_mont(r,r_01,pBVar6,r_00,(BN_CTX *)ctx,m_ctx), iVar3 = iVar5,
                   iVar2 == 0)) goto LAB_0020daee;
                uVar10 = 2;
                goto LAB_0020d9e8;
              }
              if (iVar5 != 0) goto LAB_0020d903;
            }
            iVar4 = iVar4 + 1;
          } while (iVar4 != 0x1000);
          bVar13 = true;
          goto LAB_0020d56b;
        }
        bVar13 = true;
      } while (iVar4 == 0);
      goto LAB_0020d903;
    }
  }
  BN_CTX_end((BN_CTX *)ctx);
  iVar3 = 0;
  goto LAB_0020d90f;
  while( true ) {
    pBVar7 = BN_value_one();
    iVar2 = BN_add(r_01,r_01,pBVar7);
    if (iVar2 == 0) break;
    uVar10 = uVar10 + 1;
    iVar2 = BN_mod_exp_mont(r,r_01,pBVar6,r_00,(BN_CTX *)ctx,m_ctx);
    if (iVar2 == 0) break;
LAB_0020d9e8:
    iVar2 = BN_is_one((BIGNUM *)r);
    if (iVar2 == 0) {
      iVar2 = BN_GENCB_call((BN_GENCB *)cb,3,1);
      if (iVar2 != 0) {
        BN_free((BIGNUM *)dsa->p);
        BN_free((BIGNUM *)dsa->q);
        BN_free((BIGNUM *)dsa->g);
        pBVar6 = BN_dup(r_00);
        dsa->p = (BIGNUM *)pBVar6;
        pBVar6 = BN_dup(ret);
        dsa->q = (BIGNUM *)pBVar6;
        pBVar6 = BN_dup(r);
        dsa->g = (BIGNUM *)pBVar6;
        if ((dsa->p != (BIGNUM *)0x0) && (pBVar6 != (BIGNUM *)0x0 && dsa->q != (BIGNUM *)0x0)) {
          if (out_counter != (int *)0x0) {
            *out_counter = iVar4;
          }
          iVar3 = 1;
          if (out_h != (unsigned_long *)0x0) {
            *out_h = (ulong)uVar10;
          }
        }
      }
      break;
    }
  }
LAB_0020daee:
  BN_MONT_CTX_free(m_ctx);
LAB_0020d903:
  BN_CTX_end((BN_CTX *)ctx);
LAB_0020d90f:
  BN_CTX_free((BN_CTX *)ctx);
  return iVar3;
}

Assistant:

int DSA_generate_parameters_ex(DSA *dsa, unsigned bits, const uint8_t *seed_in,
                               size_t seed_len, int *out_counter,
                               unsigned long *out_h, BN_GENCB *cb) {
  if (bits > OPENSSL_DSA_MAX_MODULUS_BITS) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_INVALID_PARAMETERS);
    return 0;
  }

  unsigned char seed[SHA256_DIGEST_LENGTH];
  unsigned char md[SHA256_DIGEST_LENGTH];
  unsigned char buf[SHA256_DIGEST_LENGTH], buf2[SHA256_DIGEST_LENGTH];
  BIGNUM *r0, *W, *X, *c, *test;
  BIGNUM *g = NULL, *q = NULL, *p = NULL;
  int k, n = 0, m = 0;
  int counter = 0;
  int r = 0;
  unsigned int h = 2;
  const EVP_MD *evpmd;

  evpmd = (bits >= 2048) ? EVP_sha256() : EVP_sha1();
  size_t qsize = EVP_MD_size(evpmd);

  if (bits < 512) {
    bits = 512;
  }

  bits = (bits + 63) / 64 * 64;

  if (seed_in != NULL) {
    if (seed_len < qsize) {
      return 0;
    }
    if (seed_len > qsize) {
      // Only consume as much seed as is expected.
      seed_len = qsize;
    }
    OPENSSL_memcpy(seed, seed_in, seed_len);
  }

  bssl::UniquePtr<BN_CTX> ctx(BN_CTX_new());
  if (ctx == nullptr) {
    return 0;
  }
  bssl::BN_CTXScope scope(ctx.get());

  r0 = BN_CTX_get(ctx.get());
  g = BN_CTX_get(ctx.get());
  W = BN_CTX_get(ctx.get());
  q = BN_CTX_get(ctx.get());
  X = BN_CTX_get(ctx.get());
  c = BN_CTX_get(ctx.get());
  p = BN_CTX_get(ctx.get());
  test = BN_CTX_get(ctx.get());

  if (test == NULL || !BN_lshift(test, BN_value_one(), bits - 1)) {
    return 0;
  }

  for (;;) {
    // Find q.
    for (;;) {
      // step 1
      if (!BN_GENCB_call(cb, BN_GENCB_GENERATED, m++)) {
        return 0;
      }

      int use_random_seed = (seed_in == NULL);
      if (use_random_seed) {
        if (!RAND_bytes(seed, qsize)) {
          return 0;
        }
        // DSA parameters are public.
        CONSTTIME_DECLASSIFY(seed, qsize);
      } else {
        // If we come back through, use random seed next time.
        seed_in = NULL;
      }
      OPENSSL_memcpy(buf, seed, qsize);
      OPENSSL_memcpy(buf2, seed, qsize);
      // precompute "SEED + 1" for step 7:
      for (size_t i = qsize - 1; i < qsize; i--) {
        buf[i]++;
        if (buf[i] != 0) {
          break;
        }
      }

      // step 2
      if (!EVP_Digest(seed, qsize, md, NULL, evpmd, NULL) ||
          !EVP_Digest(buf, qsize, buf2, NULL, evpmd, NULL)) {
        return 0;
      }
      for (size_t i = 0; i < qsize; i++) {
        md[i] ^= buf2[i];
      }

      // step 3
      md[0] |= 0x80;
      md[qsize - 1] |= 0x01;
      if (!BN_bin2bn(md, qsize, q)) {
        return 0;
      }

      // step 4
      r = BN_is_prime_fasttest_ex(q, DSS_prime_checks, ctx.get(),
                                  use_random_seed, cb);
      if (r > 0) {
        break;
      }
      if (r != 0) {
        return 0;
      }

      // do a callback call
      // step 5
    }

    if (!BN_GENCB_call(cb, 2, 0) || !BN_GENCB_call(cb, 3, 0)) {
      return 0;
    }

    // step 6
    counter = 0;
    // "offset = 2"

    n = (bits - 1) / 160;

    for (;;) {
      if ((counter != 0) && !BN_GENCB_call(cb, BN_GENCB_GENERATED, counter)) {
        return 0;
      }

      // step 7
      BN_zero(W);
      // now 'buf' contains "SEED + offset - 1"
      for (k = 0; k <= n; k++) {
        // obtain "SEED + offset + k" by incrementing:
        for (size_t i = qsize - 1; i < qsize; i--) {
          buf[i]++;
          if (buf[i] != 0) {
            break;
          }
        }

        if (!EVP_Digest(buf, qsize, md, NULL, evpmd, NULL)) {
          return 0;
        }

        // step 8
        if (!BN_bin2bn(md, qsize, r0) || !BN_lshift(r0, r0, (qsize << 3) * k) ||
            !BN_add(W, W, r0)) {
          return 0;
        }
      }

      // more of step 8
      if (!BN_mask_bits(W, bits - 1) || !BN_copy(X, W) || !BN_add(X, X, test)) {
        return 0;
      }

      // step 9
      if (!BN_lshift1(r0, q) || !BN_mod(c, X, r0, ctx.get()) ||
          !BN_sub(r0, c, BN_value_one()) || !BN_sub(p, X, r0)) {
        return 0;
      }

      // step 10
      if (BN_cmp(p, test) >= 0) {
        // step 11
        r = BN_is_prime_fasttest_ex(p, DSS_prime_checks, ctx.get(), 1, cb);
        if (r > 0) {
          goto end;  // found it
        }
        if (r != 0) {
          return 0;
        }
      }

      // step 13
      counter++;
      // "offset = offset + n + 1"

      // step 14
      if (counter >= 4096) {
        break;
      }
    }
  }
end:
  if (!BN_GENCB_call(cb, 2, 1)) {
    return 0;
  }

  // We now need to generate g
  // Set r0=(p-1)/q
  if (!BN_sub(test, p, BN_value_one()) ||
      !BN_div(r0, NULL, test, q, ctx.get())) {
    return 0;
  }

  bssl::UniquePtr<BN_MONT_CTX> mont(BN_MONT_CTX_new_for_modulus(p, ctx.get()));
  if (mont == nullptr || !BN_set_word(test, h)) {
    return 0;
  }

  for (;;) {
    // g=test^r0%p
    if (!BN_mod_exp_mont(g, test, r0, p, ctx.get(), mont.get())) {
      return 0;
    }
    if (!BN_is_one(g)) {
      break;
    }
    if (!BN_add(test, test, BN_value_one())) {
      return 0;
    }
    h++;
  }

  if (!BN_GENCB_call(cb, 3, 1)) {
    return 0;
  }

  BN_free(dsa->p);
  BN_free(dsa->q);
  BN_free(dsa->g);
  dsa->p = BN_dup(p);
  dsa->q = BN_dup(q);
  dsa->g = BN_dup(g);
  if (dsa->p == NULL || dsa->q == NULL || dsa->g == NULL) {
    return 0;
  }
  if (out_counter != NULL) {
    *out_counter = counter;
  }
  if (out_h != NULL) {
    *out_h = h;
  }

  return 1;
}